

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

Float pbrt::SampleTent(Float u,Float radius)

{
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined4 in_XMM1_Db;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined8 local_30;
  undefined1 local_28 [16];
  Float local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  auVar7._8_4_ = 0x3f000000;
  auVar7._0_8_ = 0x3f0000003f000000;
  auVar7._12_4_ = 0x3f000000;
  local_30 = vmovlps_avx(auVar7);
  fVar9 = 0.0;
  lVar2 = 0;
  do {
    fVar9 = fVar9 + *(float *)(local_28 + lVar2 + -8);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 8);
  lVar2 = 0;
  do {
    if (u < *(float *)(local_28 + lVar2 * 4 + -8) / fVar9) goto LAB_002f6b50;
    u = u - *(float *)(local_28 + lVar2 * 4 + -8) / fVar9;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 2);
  lVar2 = 2;
LAB_002f6b50:
  local_28._0_4_ = u;
  local_18 = radius;
  uStack_14 = in_XMM1_Db;
  uStack_10 = in_XMM1_Dc;
  uStack_c = in_XMM1_Dd;
  if ((SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg == '\0') &&
     (iVar1 = __cxa_guard_acquire(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg)
     , iVar1 != 0)) {
    StatRegisterer::StatRegisterer
              ((StatRegisterer *)&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg,
               SampleDiscrete(pstd::span<float_const>,float,float*,float*)::
               {lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0);
    __cxa_guard_release(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg);
  }
  *(long *)(in_FS_OFFSET + -0x610) = *(long *)(in_FS_OFFSET + -0x610) + 1;
  if (lVar2 == 2) {
    *(long *)(in_FS_OFFSET + -0x618) = *(long *)(in_FS_OFFSET + -0x618) + 1;
    lVar2 = 1;
  }
  auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                      ZEXT416((uint)((float)local_28._0_4_ /
                                    (*(float *)(local_28 + (long)(int)lVar2 * 4 + -8) / fVar9))));
  fVar9 = auVar7._0_4_;
  if ((int)lVar2 == 0) {
    auVar8._4_4_ = uStack_14;
    auVar8._0_4_ = local_18;
    auVar8._8_4_ = uStack_10;
    auVar8._12_4_ = uStack_c;
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    local_28 = vxorps_avx512vl(auVar8,auVar4);
    auVar4 = ZEXT816(0);
    if ((fVar9 != 0.0) || (NAN(fVar9))) {
      auVar4 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - fVar9)),ZEXT816(0) << 0x20,auVar7);
      if (auVar4._0_4_ < 0.0) {
        fVar3 = sqrtf(auVar4._0_4_);
        auVar7 = ZEXT416((uint)fVar9);
      }
      else {
        auVar4 = vsqrtss_avx(auVar4,auVar4);
        fVar3 = auVar4._0_4_;
      }
      auVar6._0_4_ = auVar7._0_4_ / (fVar3 + 0.0);
      auVar6._4_12_ = auVar7._4_12_;
      auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar6);
      auVar8._4_4_ = uStack_14;
      auVar8._0_4_ = local_18;
      auVar8._8_4_ = uStack_10;
      auVar8._12_4_ = uStack_c;
    }
    auVar7 = vfmadd213ss_fma(auVar4,auVar8,local_28);
    fVar9 = auVar7._0_4_;
  }
  else {
    fVar3 = (1.0 - fVar9) + fVar9 * 0.0;
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
      auVar7 = ZEXT416((uint)fVar9);
    }
    else {
      auVar4 = vsqrtss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
      fVar3 = auVar4._0_4_;
    }
    auVar5._0_4_ = auVar7._0_4_ / (fVar3 + 1.0);
    auVar5._4_12_ = auVar7._4_12_;
    auVar7 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar5);
    fVar9 = auVar7._0_4_ * local_18;
  }
  return fVar9;
}

Assistant:

PBRT_CPU_GPU
inline Float SampleTent(Float u, Float radius) {
    if (SampleDiscrete({0.5f, 0.5f}, u, nullptr, &u) == 0)
        return -radius + radius * SampleLinear(u, 0, 1);
    else
        return radius * SampleLinear(u, 1, 0);
}